

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O1

App * __thiscall CLI::App::get_option_group(App *this,string *group_name)

{
  pointer psVar1;
  App *pAVar2;
  size_t __n;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  OptionNotFound *this_00;
  App *unaff_R14;
  App_p *app;
  pointer psVar7;
  bool bVar8;
  string local_50;
  
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar7 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar5 = psVar7 != psVar1, bVar5;
      psVar7 = psVar7 + 1) {
    pAVar2 = (psVar7->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    bVar4 = true;
    if ((pAVar2->name_)._M_string_length == 0) {
      __n = (pAVar2->group_)._M_string_length;
      if (__n == group_name->_M_string_length) {
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar6 = bcmp((pAVar2->group_)._M_dataplus._M_p,(group_name->_M_dataplus)._M_p,__n);
          bVar8 = iVar6 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      bVar4 = (bool)(bVar8 ^ 1);
      if (bVar8) {
        unaff_R14 = pAVar2;
      }
    }
    if (!bVar4) break;
  }
  if (!bVar5) {
    this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar3 = (group_name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar3,pcVar3 + group_name->_M_string_length);
    OptionNotFound::OptionNotFound(this_00,&local_50);
    __cxa_throw(this_00,&OptionNotFound::typeinfo,Error::~Error);
  }
  return unaff_R14;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App *App::get_option_group(std::string group_name) const {
    for(const App_p &app : subcommands_) {
        if(app->name_.empty() && app->group_ == group_name) {
            return app.get();
        }
    }
    throw OptionNotFound(group_name);
}